

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

MemChunk * __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::treeMalloc
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,size_type size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  MemChunk *pMVar4;
  ulong uVar5;
  PtrAVLTree *this_00;
  size_type actualSize;
  
  uVar2 = (uint)(size >> 8);
  if (uVar2 == 0) {
    uVar5 = 0;
  }
  else if (uVar2 < 0x10000) {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar5 = (ulong)((uint)((size >> ((ulong)(byte)(0x26 - (char)(uVar1 ^ 0x1f)) & 0x3f) & 1) != 0) +
                    (uVar1 ^ 0x1f) * 2 ^ 0x3e);
  }
  else {
    uVar5 = 0x1f;
  }
  this_00 = this->m_largeTrees + uVar5;
  actualSize = size;
  do {
    if (0x1f < uVar5) {
      return (MemChunk *)0x0;
    }
    if (this_00->m_root != (Node *)0x0) {
      iVar3 = PtrAVLTree::remove(this_00,(char *)&actualSize);
      if ((MemChunk *)CONCAT44(extraout_var,iVar3) != (MemChunk *)0x0) {
        pMVar4 = splitChunk(this,(MemChunk *)CONCAT44(extraout_var,iVar3),size);
        return pMVar4;
      }
    }
    uVar5 = uVar5 + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

inline MemChunk*
    treeMalloc (size_type size)
    {
        MemChunk* chunk = nullptr;
        size_type  actualSize = size;

        BinIndexType binIndex;
        cookmem_getLargeBinIndex (size, binIndex);

        for (; binIndex < NTREEBINS; ++binIndex)
        {
            PtrAVLTree& tree = treeAt(binIndex);
            if (!tree.isEmpty ())
            {
                chunk = reinterpret_cast<MemChunk*>(tree.remove(actualSize));
                if (chunk != nullptr)
                    break;
            }
        }

        if (chunk != nullptr)
        {
            return splitChunk (chunk, size);
        }
        return nullptr;
    }